

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateVoid(ExpressionEvalContext *ctx,ExprBase *expression)

{
  ExprBase *pEVar1;
  ExprBase *expression_local;
  ExpressionEvalContext *ctx_local;
  
  pEVar1 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
  ExprVoid::ExprVoid((ExprVoid *)pEVar1,expression->source,ctx->ctx->typeVoid);
  pEVar1 = CheckType(expression,pEVar1);
  return pEVar1;
}

Assistant:

ExprBase* EvaluateVoid(ExpressionEvalContext &ctx, ExprBase *expression)
{
	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}